

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vectorhulls.cpp
# Opt level: O0

ImVec2 VHRotateV(ImVec2 v,double theta)

{
  undefined8 in_XMM0_Qa;
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double in_XMM1_Qa;
  double ny;
  double nx;
  float local_10;
  float fStack_c;
  ImVec2 local_8;
  
  local_10 = (float)in_XMM0_Qa;
  dVar1 = cos(in_XMM1_Qa);
  fStack_c = (float)((ulong)in_XMM0_Qa >> 0x20);
  dVar2 = sin(in_XMM1_Qa);
  dVar3 = sin(in_XMM1_Qa);
  dVar4 = cos(in_XMM1_Qa);
  ImVec2::ImVec2(&local_8,(float)((double)local_10 * dVar1 - (double)fStack_c * dVar2),
                 (float)((double)local_10 * dVar3 + (double)fStack_c * dVar4));
  return local_8;
}

Assistant:

ImVec2 VHRotateV(ImVec2 v, double theta) {
	double nx, ny;

	nx = v.x * cos(theta) - v.y * sin(theta);
	ny = v.x * sin(theta) + v.y * cos(theta);

	return ImVec2(nx, ny);
}